

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O1

void lj_tab_clear(GCtab *t)

{
  uint uVar1;
  uint32_t uVar2;
  Node *node;
  ulong uVar3;
  Node *pNVar4;
  long lVar5;
  
  node = (Node *)(ulong)t->asize;
  if (node != (Node *)0x0) {
    uVar1 = (t->array).ptr32;
    pNVar4 = (Node *)0x0;
    do {
      *(undefined4 *)((ulong)uVar1 + 4 + (long)pNVar4 * 8) = 0xffffffff;
      pNVar4 = (Node *)((long)&(pNVar4->val).fr.func.gcptr32 + 1);
    } while (node != pNVar4);
  }
  uVar2 = t->hmask;
  if (uVar2 != 0) {
    uVar1 = (t->node).ptr32;
    uVar3 = (ulong)uVar1;
    *(uint *)(uVar3 + 0x14) = uVar1 + (uVar2 + 1) * 0x18;
    lVar5 = 0;
    do {
      *(undefined8 *)(uVar3 + 0xc + lVar5) = 0xffffffff;
      *(undefined4 *)(uVar3 + 4 + lVar5) = 0xffffffff;
      lVar5 = lVar5 + 0x18;
    } while ((ulong)(uVar2 + 1 + (uint)(uVar2 + 1 == 0)) * 0x18 != lVar5);
  }
  return;
}

Assistant:

static LJ_AINLINE void clearapart(GCtab *t)
{
  uint32_t i, asize = t->asize;
  TValue *array = tvref(t->array);
  for (i = 0; i < asize; i++)
    setnilV(&array[i]);
}